

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O0

bool __thiscall S2Cap::Contains(S2Cap *this,S2Point *p)

{
  bool bVar1;
  ostream *poVar2;
  S1ChordAngle local_50 [3];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  S2Point *local_18;
  S2Point *p_local;
  S2Cap *this_local;
  
  local_18 = p;
  p_local = (S2Point *)this;
  bVar1 = S2::IsUnitLength(p);
  local_31 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.cc"
               ,0x123,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar2 = S2LogMessage::stream(&local_30);
    poVar2 = std::operator<<(poVar2,"Check failed: S2::IsUnitLength(p) ");
    S2LogMessageVoidify::operator&(&local_19,poVar2);
  }
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  S1ChordAngle::S1ChordAngle(local_50,&this->center_,local_18);
  bVar1 = operator<=(local_50[0],(S1ChordAngle)(this->radius_).length2_);
  return bVar1;
}

Assistant:

bool S2Cap::Contains(const S2Point& p) const {
  S2_DCHECK(S2::IsUnitLength(p));
  return S1ChordAngle(center_, p) <= radius_;
}